

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void ptls__key_schedule_update_hash
               (ptls_key_schedule_t *sched,uint8_t *msg,size_t msglen,int use_outer)

{
  ptls_hash_context_t **pppVar1;
  size_t sVar2;
  ptls_hash_context_t **pppVar3;
  
  pppVar3 = &sched->hashes[0].ctx_outer;
  for (sVar2 = 0; sVar2 != sched->num_hashes; sVar2 = sVar2 + 1) {
    pppVar1 = pppVar3 + -1;
    if (use_outer != 0) {
      pppVar1 = pppVar3;
    }
    (*(*pppVar1)->update)(*pppVar1,msg,msglen);
    pppVar3 = pppVar3 + 3;
  }
  return;
}

Assistant:

void ptls__key_schedule_update_hash(ptls_key_schedule_t *sched, const uint8_t *msg, size_t msglen, int use_outer)
{
    size_t i;

    PTLS_DEBUGF("%s:%p:len=%zu\n", __FUNCTION__, sched, msglen);
    for (i = 0; i != sched->num_hashes; ++i) {
        ptls_hash_context_t *ctx = use_outer ? sched->hashes[i].ctx_outer : sched->hashes[i].ctx;
        ctx->update(ctx, msg, msglen);
#if defined(PTLS_DEBUG) && PTLS_DEBUG
        {
            uint8_t digest[PTLS_MAX_DIGEST_SIZE];
            ctx->final(ctx, digest, PTLS_HASH_FINAL_MODE_SNAPSHOT);
            PTLS_DEBUGF("  %zu: %02x%02x%02x%02x\n", i, digest[0], digest[1], digest[2], digest[3]);
        }
#endif
    }
}